

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

int check16u(aint val)

{
  char local_58 [8];
  char buffer [64];
  int local_c;
  aint val_local;
  
  if ((val < 0) || (0xffff < val)) {
    snprintf(local_58,0x40,"value 0x%X is truncated to 16bit value: 0x%04X",(ulong)(uint)val,
             (ulong)(val & 0xffff));
    Warning(local_58,(char *)0x0,W_PASS3);
    local_c = 0;
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

int check16u(aint val) {
	if (val < 0 || val > 65535) {
		char buffer[64];
		SPRINTF2(buffer, 64, "value 0x%X is truncated to 16bit value: 0x%04X", val, val&0xFFFF);
		Warning(buffer);
		return 0;
	}
	return 1;
}